

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

cs_err cs_option(csh ud,cs_opt_type type,size_t value)

{
  uint8_t uVar1;
  insn_mnem *piVar2;
  uint *in_RDX;
  cs_opt_type in_ESI;
  cs_struct *in_RDI;
  insn_mnem *tmp_1;
  insn_mnem *prev;
  insn_mnem *tmp;
  cs_opt_mem *mem;
  cs_opt_mnem *opt;
  cs_struct *handle;
  insn_mnem *local_50;
  insn_mnem *local_48;
  insn_mnem *local_40;
  cs_err local_4;
  
  if (in_ESI == CS_OPT_MEM) {
    cs_mem_malloc = *(cs_malloc_t *)in_RDX;
    cs_mem_calloc = *(cs_calloc_t *)(in_RDX + 2);
    cs_mem_realloc = *(cs_realloc_t *)(in_RDX + 4);
    cs_mem_free = *(cs_free_t *)(in_RDX + 6);
    cs_vsnprintf = *(cs_vsnprintf_t *)(in_RDX + 8);
    return CS_ERR_OK;
  }
  if (in_RDI == (cs_struct *)0x0) {
    return CS_ERR_CSH;
  }
  switch(in_ESI) {
  case CS_OPT_DETAIL:
    in_RDI->detail = (cs_opt_value)in_RDX;
    local_4 = CS_ERR_OK;
    break;
  case CS_OPT_MODE:
    if (((ulong)in_RDX & (long)cs_arch_disallowed_mode_mask[in_RDI->arch]) != 0) {
      return CS_ERR_OPTION;
    }
    goto LAB_00251590;
  default:
LAB_00251590:
    local_4 = (*cs_arch_option[in_RDI->arch])(in_RDI,in_ESI,(size_t)in_RDX);
    break;
  case CS_OPT_SKIPDATA:
    in_RDI->skipdata = in_RDX == (uint *)0x3;
    if (((in_RDI->skipdata & 1U) != 0) && (in_RDI->skipdata_size == '\0')) {
      uVar1 = skipdata_size(in_RDI);
      in_RDI->skipdata_size = uVar1;
    }
    local_4 = CS_ERR_OK;
    break;
  case CS_OPT_SKIPDATA_SETUP:
    if (in_RDX != (uint *)0x0) {
      (in_RDI->skipdata_setup).mnemonic = *(char **)in_RDX;
      (in_RDI->skipdata_setup).callback = *(cs_skipdata_cb_t *)(in_RDX + 2);
      (in_RDI->skipdata_setup).user_data = *(void **)(in_RDX + 4);
    }
    local_4 = CS_ERR_OK;
    break;
  case CS_OPT_MNEMONIC:
    if (*in_RDX != 0) {
      if (*(long *)(in_RDX + 2) != 0) {
        local_40 = in_RDI->mnem_list;
        do {
          if (local_40 == (insn_mnem *)0x0) {
LAB_00251444:
            if (local_40 == (insn_mnem *)0x0) {
              piVar2 = (insn_mnem *)(*cs_mem_malloc)(0x30);
              (piVar2->insn).id = *in_RDX;
              strncpy((piVar2->insn).mnemonic,*(char **)(in_RDX + 2),0x1f);
              (piVar2->insn).mnemonic[0x1f] = '\0';
              piVar2->next = in_RDI->mnem_list;
              in_RDI->mnem_list = piVar2;
            }
            return CS_ERR_OK;
          }
          if ((local_40->insn).id == *in_RDX) {
            strncpy((local_40->insn).mnemonic,*(char **)(in_RDX + 2),0x1f);
            (local_40->insn).mnemonic[0x1f] = '\0';
            goto LAB_00251444;
          }
          local_40 = local_40->next;
        } while( true );
      }
      local_50 = in_RDI->mnem_list;
      local_48 = local_50;
      for (; local_50 != (insn_mnem *)0x0; local_50 = local_50->next) {
        if ((local_50->insn).id == *in_RDX) {
          if (local_50 == local_48) {
            in_RDI->mnem_list = local_50->next;
          }
          else {
            local_48->next = local_50->next;
          }
          (*cs_mem_free)(local_50);
          break;
        }
        local_48 = local_50;
      }
    }
    local_4 = CS_ERR_OK;
    break;
  case CS_OPT_UNSIGNED:
    in_RDI->imm_unsigned = (cs_opt_value)in_RDX;
    local_4 = CS_ERR_OK;
  }
  return local_4;
}

Assistant:

CAPSTONE_API cs_option(csh ud, cs_opt_type type, size_t value)
{
	struct cs_struct *handle;
	cs_opt_mnem *opt;

	// cs_option() can be called with NULL handle just for CS_OPT_MEM
	// This is supposed to be executed before all other APIs (even cs_open())
	if (type == CS_OPT_MEM) {
		cs_opt_mem *mem = (cs_opt_mem *)value;

		cs_mem_malloc = mem->malloc;
		cs_mem_calloc = mem->calloc;
		cs_mem_realloc = mem->realloc;
		cs_mem_free = mem->free;
		cs_vsnprintf = mem->vsnprintf;

		return CS_ERR_OK;
	}

	handle = (struct cs_struct *)(uintptr_t)ud;
	if (!handle)
		return CS_ERR_CSH;

	switch(type) {
		default:
			break;

		case CS_OPT_UNSIGNED:
			handle->imm_unsigned = (cs_opt_value)value;
			return CS_ERR_OK;

		case CS_OPT_DETAIL:
			handle->detail = (cs_opt_value)value;
			return CS_ERR_OK;

		case CS_OPT_SKIPDATA:
			handle->skipdata = (value == CS_OPT_ON);
			if (handle->skipdata) {
				if (handle->skipdata_size == 0) {
					// set the default skipdata size
					handle->skipdata_size = skipdata_size(handle);
				}
			}
			return CS_ERR_OK;

		case CS_OPT_SKIPDATA_SETUP:
			if (value)
				handle->skipdata_setup = *((cs_opt_skipdata *)value);
			return CS_ERR_OK;

		case CS_OPT_MNEMONIC:
			opt = (cs_opt_mnem *)value;
			if (opt->id) {
				if (opt->mnemonic) {
					struct insn_mnem *tmp;

					// add new instruction, or replace existing instruction
					// 1. find if we already had this insn in the linked list
					tmp = handle->mnem_list;
					while(tmp) {
						if (tmp->insn.id == opt->id) {
							// found this instruction, so replace its mnemonic
							(void)strncpy(tmp->insn.mnemonic, opt->mnemonic, sizeof(tmp->insn.mnemonic) - 1);
							tmp->insn.mnemonic[sizeof(tmp->insn.mnemonic) - 1] = '\0';
							break;
						}
						tmp = tmp->next;
					}

					// 2. add this instruction if we have not had it yet
					if (!tmp) {
						tmp = cs_mem_malloc(sizeof(*tmp));
						tmp->insn.id = opt->id;
						(void)strncpy(tmp->insn.mnemonic, opt->mnemonic, sizeof(tmp->insn.mnemonic) - 1);
						tmp->insn.mnemonic[sizeof(tmp->insn.mnemonic) - 1] = '\0';
						// this new instruction is heading the list
						tmp->next = handle->mnem_list;
						handle->mnem_list = tmp;
					}
					return CS_ERR_OK;
				} else {
					struct insn_mnem *prev, *tmp;

					// we want to delete an existing instruction
					// iterate the list to find the instruction to remove it
					tmp = handle->mnem_list;
					prev = tmp;
					while(tmp) {
						if (tmp->insn.id == opt->id) {
							// delete this instruction
							if (tmp == prev) {
								// head of the list
								handle->mnem_list = tmp->next;
							} else {
								prev->next = tmp->next;
							}
							cs_mem_free(tmp);
							break;
						}
						prev = tmp;
						tmp = tmp->next;
					}
				}
			}
			return CS_ERR_OK;

		case CS_OPT_MODE:
			// verify if requested mode is valid
			if (value & cs_arch_disallowed_mode_mask[handle->arch]) {
				return CS_ERR_OPTION;
			}
			break;
	}

	return cs_arch_option[handle->arch](handle, type, value);
}